

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

CBlockIndex * __thiscall Chainstate::FindMostWorkChain(Chainstate *this)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  uint uVar1;
  CBlockIndex *pCVar2;
  pointer ppCVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  CBlockIndex *pCVar7;
  _Rb_tree_header *p_Var8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar9;
  reverse_iterator it;
  CBlockIndex *pindexTest;
  CBlockIndex *local_70;
  pair<CBlockIndex_*,_CBlockIndex_*> local_58;
  CBlockIndex *local_48;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->setBlockIndexCandidates;
  p_Var8 = &(this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (p_Var8 == (_Rb_tree_header *)
                  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left) {
      local_70 = (CBlockIndex *)0x0;
      bVar4 = false;
    }
    else {
      lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var8);
      pCVar2 = *(CBlockIndex **)(lVar6 + 0x20);
      bVar4 = false;
      local_40 = pCVar2;
      do {
        if (local_40 == (CBlockIndex *)0x0) break;
        iVar5 = local_40->nHeight;
        if (((long)iVar5 < 0) ||
           (ppCVar3 = (this->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (int)((ulong)((long)(this->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3) <=
           iVar5)) {
          pCVar7 = (CBlockIndex *)0x0;
        }
        else {
          pCVar7 = ppCVar3[iVar5];
        }
        if (pCVar7 == local_40) break;
        if ((iVar5 != 0) && (local_40->m_chain_tx_count == 0)) {
          __assert_fail("pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ,0xcbb,"CBlockIndex *Chainstate::FindMostWorkChain()");
        }
        uVar1 = local_40->nStatus;
        if ((uVar1 & 0x68) == 8) {
          local_40 = local_40->pprev;
        }
        else {
          if (((uVar1 & 0x60) != 0) &&
             ((pCVar7 = this->m_chainman->m_best_invalid, pCVar7 == (CBlockIndex *)0x0 ||
              (iVar5 = base_uint<256U>::CompareTo
                                 (&(pCVar2->nChainWork).super_base_uint<256U>,
                                  &(pCVar7->nChainWork).super_base_uint<256U>), 0 < iVar5)))) {
            this->m_chainman->m_best_invalid = pCVar2;
          }
          local_48 = pCVar2;
          if (local_40 != pCVar2) {
            do {
              if ((uVar1 & 0x60) == 0) {
                if ((uVar1 & 8) == 0) {
                  local_58.first = local_48->pprev;
                  local_58.second = local_48;
                  std::
                  _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                  ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                            ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                              *)&this->m_blockman->m_blocks_unlinked,&local_58);
                }
              }
              else {
                *(byte *)&local_48->nStatus = (byte)local_48->nStatus | 0x40;
                std::
                _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                ::_M_insert_unique<CBlockIndex*const&>
                          ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                            *)&this->m_blockman->m_dirty_blockindex,&local_48);
              }
              pVar9 = std::
                      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                      ::equal_range(&this_00->_M_t,&local_48);
              std::
              _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
              ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,
                             (_Base_ptr)pVar9.second._M_node);
              local_48 = local_48->pprev;
            } while (local_40 != local_48);
          }
          pVar9 = std::
                  _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                  ::equal_range(&this_00->_M_t,&local_40);
          std::
          _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,
                         (_Base_ptr)pVar9.second._M_node);
          bVar4 = true;
        }
      } while ((uVar1 & 0x68) == 8);
      if (!bVar4) {
        local_70 = pCVar2;
      }
    }
    if (!bVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return local_70;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

CBlockIndex* Chainstate::FindMostWorkChain()
{
    AssertLockHeld(::cs_main);
    do {
        CBlockIndex *pindexNew = nullptr;

        // Find the best candidate header.
        {
            std::set<CBlockIndex*, CBlockIndexWorkComparator>::reverse_iterator it = setBlockIndexCandidates.rbegin();
            if (it == setBlockIndexCandidates.rend())
                return nullptr;
            pindexNew = *it;
        }

        // Check whether all blocks on the path between the currently active chain and the candidate are valid.
        // Just going until the active chain is an optimization, as we know all blocks in it are valid already.
        CBlockIndex *pindexTest = pindexNew;
        bool fInvalidAncestor = false;
        while (pindexTest && !m_chain.Contains(pindexTest)) {
            assert(pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0);

            // Pruned nodes may have entries in setBlockIndexCandidates for
            // which block files have been deleted.  Remove those as candidates
            // for the most work chain if we come across them; we can't switch
            // to a chain unless we have all the non-active-chain parent blocks.
            bool fFailedChain = pindexTest->nStatus & BLOCK_FAILED_MASK;
            bool fMissingData = !(pindexTest->nStatus & BLOCK_HAVE_DATA);
            if (fFailedChain || fMissingData) {
                // Candidate chain is not usable (either invalid or missing data)
                if (fFailedChain && (m_chainman.m_best_invalid == nullptr || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork)) {
                    m_chainman.m_best_invalid = pindexNew;
                }
                CBlockIndex *pindexFailed = pindexNew;
                // Remove the entire chain from the set.
                while (pindexTest != pindexFailed) {
                    if (fFailedChain) {
                        pindexFailed->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(pindexFailed);
                    } else if (fMissingData) {
                        // If we're missing data, then add back to m_blocks_unlinked,
                        // so that if the block arrives in the future we can try adding
                        // to setBlockIndexCandidates again.
                        m_blockman.m_blocks_unlinked.insert(
                            std::make_pair(pindexFailed->pprev, pindexFailed));
                    }
                    setBlockIndexCandidates.erase(pindexFailed);
                    pindexFailed = pindexFailed->pprev;
                }
                setBlockIndexCandidates.erase(pindexTest);
                fInvalidAncestor = true;
                break;
            }
            pindexTest = pindexTest->pprev;
        }
        if (!fInvalidAncestor)
            return pindexNew;
    } while(true);
}